

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_impl.hpp
# Opt level: O2

int __thiscall
wigwag::detail::
signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
::connect(signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
          *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  long lVar1;
  ulong uVar2;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  _Any_data local_48;
  long local_38;
  undefined8 local_30;
  
  uVar2 = (**(code **)(*(long *)CONCAT44(in_register_00000034,__fd) + 0x30))
                    ((long *)CONCAT44(in_register_00000034,__fd));
  if ((uVar2 & 2) == 0) {
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_38 = 0;
    local_30 = *(undefined8 *)(__addr[1].sa_data + 6);
    lVar1._0_2_ = __addr[1].sa_family;
    lVar1._2_1_ = __addr[1].sa_data[0];
    lVar1._3_1_ = __addr[1].sa_data[1];
    lVar1._4_1_ = __addr[1].sa_data[2];
    lVar1._5_1_ = __addr[1].sa_data[3];
    lVar1._6_1_ = __addr[1].sa_data[4];
    lVar1._7_1_ = __addr[1].sa_data[5];
    if (lVar1 != 0) {
      local_48._M_unused._0_8_ = (undefined8)*(undefined8 *)__addr;
      local_48._8_8_ = *(undefined8 *)(__addr->sa_data + 6);
      __addr[1].sa_family = 0;
      __addr[1].sa_data[0] = '\0';
      __addr[1].sa_data[1] = '\0';
      __addr[1].sa_data[2] = '\0';
      __addr[1].sa_data[3] = '\0';
      __addr[1].sa_data[4] = '\0';
      __addr[1].sa_data[5] = '\0';
      __addr[1].sa_data[6] = '\0';
      __addr[1].sa_data[7] = '\0';
      __addr[1].sa_data[8] = '\0';
      __addr[1].sa_data[9] = '\0';
      __addr[1].sa_data[10] = '\0';
      __addr[1].sa_data[0xb] = '\0';
      __addr[1].sa_data[0xc] = '\0';
      __addr[1].sa_data[0xd] = '\0';
      local_38 = lVar1;
    }
    listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
    ::connect((listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
               *)this,__fd + 8,(sockaddr *)&local_48,__len);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
    return (int)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"The signal restrains connecting synchronous handlers!")
  ;
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual token connect(handler_type handler, handler_attributes attributes)
        {
            if (contains_flag(this->get_attributes(), signal_attributes::connect_async_only))
                WIGWAG_THROW("The signal restrains connecting synchronous handlers!");

            return listenable_base::connect(std::move(handler), attributes);
        }